

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O2

t_int * sigbiquad_perform(t_int *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  long lVar6;
  long lVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  t_bigorsmall32 pun;
  float fVar14;
  
  lVar6 = w[1];
  lVar7 = w[2];
  pfVar8 = (float *)w[3];
  fVar1 = pfVar8[2];
  fVar2 = pfVar8[3];
  fVar3 = pfVar8[4];
  fVar4 = pfVar8[5];
  fVar5 = pfVar8[6];
  uVar10 = 0;
  uVar9 = (ulong)*(uint *)(w + 4);
  fVar13 = *pfVar8;
  fVar12 = pfVar8[1];
  if ((int)*(uint *)(w + 4) < 1) {
    uVar9 = uVar10;
  }
  for (; fVar11 = fVar13, (int)uVar9 != (int)uVar10; uVar10 = uVar10 + 1) {
    fVar14 = fVar2 * fVar12 + fVar1 * fVar11 + *(float *)(lVar6 + uVar10 * 4);
    fVar13 = 0.0;
    if ((((uint)fVar14 >> 0x1d ^ (uint)fVar14 >> 0x1e) & 1) != 0) {
      fVar13 = fVar14;
    }
    *(float *)(lVar7 + uVar10 * 4) = fVar12 * fVar5 + fVar3 * fVar13 + fVar4 * fVar11;
    fVar12 = fVar11;
  }
  *pfVar8 = fVar11;
  pfVar8[1] = fVar12;
  return w + 5;
}

Assistant:

static t_int *sigbiquad_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    t_biquadctl *c = (t_biquadctl *)(w[3]);
    int n = (int)w[4];
    int i;
    t_sample last = c->c_x1;
    t_sample prev = c->c_x2;
    t_sample fb1 = c->c_fb1;
    t_sample fb2 = c->c_fb2;
    t_sample ff1 = c->c_ff1;
    t_sample ff2 = c->c_ff2;
    t_sample ff3 = c->c_ff3;
    for (i = 0; i < n; i++)
    {
        t_sample output =  *in++ + fb1 * last + fb2 * prev;
        if (PD_BIGORSMALL(output))
            output = 0;
        *out++ = ff1 * output + ff2 * last + ff3 * prev;
        prev = last;
        last = output;
    }
    c->c_x1 = last;
    c->c_x2 = prev;
    return (w+5);
}